

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilzo.c
# Opt level: O1

int lzo1x_1_compress(uchar *in,lzo_uint in_len,uchar *out,lzo_uint *out_len,void *wrkmem)

{
  lzo_uint lVar1;
  ulong uVar2;
  uchar *__s;
  byte bVar3;
  long lVar4;
  uchar *puVar5;
  
  lVar1 = in_len;
  puVar5 = out;
  if (0xd < in_len) {
    lVar1 = _lzo1x_1_do_compress(in,in_len,out,out_len,wrkmem);
    puVar5 = out + *out_len;
  }
  if (lVar1 != 0) {
    bVar3 = (byte)lVar1;
    if (lVar1 < 0xef && puVar5 == out) {
      *puVar5 = bVar3 + 0x11;
      puVar5 = puVar5 + 1;
    }
    else if (lVar1 < 4) {
      puVar5[-2] = puVar5[-2] | bVar3;
    }
    else {
      __s = puVar5 + 1;
      if (lVar1 < 0x13) {
        *puVar5 = bVar3 - 3;
        puVar5 = __s;
      }
      else {
        uVar2 = lVar1 - 0x12;
        *puVar5 = '\0';
        if (0xff < uVar2) {
          uVar2 = (lVar1 - 0x112) / 0xff;
          memset(__s,0,uVar2 + 1);
          __s = puVar5 + uVar2 + 2;
          puVar5 = puVar5 + uVar2 + 1;
          uVar2 = (uVar2 * -0xff + lVar1) - 0x111;
        }
        puVar5 = puVar5 + 2;
        *__s = (uchar)uVar2;
      }
    }
    lVar4 = -lVar1;
    do {
      *puVar5 = in[lVar4 + in_len];
      puVar5 = puVar5 + 1;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0);
  }
  puVar5[0] = '\x11';
  puVar5[1] = '\0';
  puVar5[2] = '\0';
  *out_len = (lzo_uint)(puVar5 + (3 - (long)out));
  return 0;
}

Assistant:

LZO_PUBLIC(int)
DO_COMPRESS      ( const lzo_bytep in , lzo_uint  in_len,
                         lzo_bytep out, lzo_uintp out_len,
                         lzo_voidp wrkmem )
{
    lzo_bytep op = out;
    lzo_uint t;

    if __lzo_unlikely(in_len <= M2_MAX_LEN + 5)
        t = in_len;
    else
    {
        t = do_compress(in,in_len,op,out_len,wrkmem);
        op += *out_len;
    }